

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O3

int __thiscall
glcts::GeometryShaderAdjacencyTests::init(GeometryShaderAdjacencyTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_> *this_00;
  int extraout_EAX;
  AdjacencyTestData *pAVar1;
  GeometryShaderAdjacency *pGVar2;
  AdjacencyTestData *local_30;
  
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  this_00 = &this->m_tests_data;
  local_30 = pAVar1;
  std::vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>>::
  emplace_back<glcts::AdjacencyTestData*>
            ((vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>> *)this_00,
             &local_30);
  pAVar1 = (this->m_tests_data).
           super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
  pAVar1->m_gs_code =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(lines_adjacency)            in;\nlayout(line_strip, max_vertices=2) out;\n\nlayout(location = 0) out vec4 out_adjacent_geometry;\nlayout(location = 1) out vec4 out_geometry;\n\nvoid main()\n{\n    out_adjacent_geometry = gl_in[0].gl_Position;\n    out_geometry          = gl_in[1].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[3].gl_Position;\n    out_geometry          = gl_in[2].gl_Position;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  pAVar1->m_mode = 10;
  pAVar1->m_tf_mode = 1;
  createGrid(this,pAVar1);
  setLinePointsNonindiced(this,pAVar1);
  pGVar2 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar2,(this->super_TestCaseGroupBase).m_context,extParams,
             "adjacency_non_indiced_lines","Test 2.1 non indiced",
             (this->m_tests_data).
             super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar2);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_30 = pAVar1;
  std::vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>>::
  emplace_back<glcts::AdjacencyTestData*>
            ((vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>> *)this_00,
             &local_30);
  pAVar1 = (this->m_tests_data).
           super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
  pAVar1->m_gs_code =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(lines_adjacency)            in;\nlayout(line_strip, max_vertices=2) out;\n\nlayout(location = 0) out vec4 out_adjacent_geometry;\nlayout(location = 1) out vec4 out_geometry;\n\nvoid main()\n{\n    out_adjacent_geometry = gl_in[0].gl_Position;\n    out_geometry          = gl_in[1].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[3].gl_Position;\n    out_geometry          = gl_in[2].gl_Position;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  pAVar1->m_mode = 10;
  pAVar1->m_tf_mode = 1;
  createGrid(this,pAVar1);
  setLinePointsindiced(this,pAVar1);
  pGVar2 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar2,(this->super_TestCaseGroupBase).m_context,extParams,"adjacency_indiced_lines",
             "Test 2.1 indiced",
             (this->m_tests_data).
             super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar2);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_30 = pAVar1;
  std::vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>>::
  emplace_back<glcts::AdjacencyTestData*>
            ((vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>> *)this_00,
             &local_30);
  pAVar1 = (this->m_tests_data).
           super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
  pAVar1->m_gs_code =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(lines_adjacency)            in;\nlayout(line_strip, max_vertices=2) out;\n\nout vec4 out_adjacent_geometry;\nout vec4 out_geometry;\n\nvoid main()\n{\n    out_adjacent_geometry = gl_in[0].gl_Position;\n    out_geometry          = gl_in[1].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[3].gl_Position;\n    out_geometry          = gl_in[2].gl_Position;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  pAVar1->m_mode = 0xb;
  pAVar1->m_tf_mode = 1;
  createGrid(this,pAVar1);
  setLineStripPointsNonindiced(this,pAVar1);
  pGVar2 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar2,(this->super_TestCaseGroupBase).m_context,extParams,
             "adjacency_non_indiced_line_strip","Test 2.3 non indiced",
             (this->m_tests_data).
             super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar2);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_30 = pAVar1;
  std::vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>>::
  emplace_back<glcts::AdjacencyTestData*>
            ((vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>> *)this_00,
             &local_30);
  pAVar1 = (this->m_tests_data).
           super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
  pAVar1->m_gs_code =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(lines_adjacency)            in;\nlayout(line_strip, max_vertices=2) out;\n\nout vec4 out_adjacent_geometry;\nout vec4 out_geometry;\n\nvoid main()\n{\n    out_adjacent_geometry = gl_in[0].gl_Position;\n    out_geometry          = gl_in[1].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[3].gl_Position;\n    out_geometry          = gl_in[2].gl_Position;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  pAVar1->m_mode = 0xb;
  pAVar1->m_tf_mode = 1;
  createGrid(this,pAVar1);
  setLineStripPointsIndiced(this,pAVar1);
  pGVar2 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar2,(this->super_TestCaseGroupBase).m_context,extParams,
             "adjacency_indiced_line_strip","Test 2.3 indiced",
             (this->m_tests_data).
             super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar2);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_30 = pAVar1;
  std::vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>>::
  emplace_back<glcts::AdjacencyTestData*>
            ((vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>> *)this_00,
             &local_30);
  pAVar1 = (this->m_tests_data).
           super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
  pAVar1->m_gs_code =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(triangles_adjacency)            in;\nlayout(triangle_strip, max_vertices=3) out;\n\nout vec4 out_adjacent_geometry;\nout vec4 out_geometry;\n\nvoid main()\n{\n    out_adjacent_geometry = gl_in[1].gl_Position;\n    out_geometry          = gl_in[0].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[3].gl_Position;\n    out_geometry          = gl_in[2].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[5].gl_Position;\n    out_geometry          = gl_in[4].gl_Position;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  pAVar1->m_mode = 0xc;
  pAVar1->m_tf_mode = 4;
  createGrid(this,pAVar1);
  setTrianglePointsNonindiced(this,pAVar1);
  pGVar2 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar2,(this->super_TestCaseGroupBase).m_context,extParams,
             "adjacency_non_indiced_triangles","Test 2.5 non indiced",
             (this->m_tests_data).
             super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar2);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_30 = pAVar1;
  std::vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>>::
  emplace_back<glcts::AdjacencyTestData*>
            ((vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>> *)this_00,
             &local_30);
  pAVar1 = (this->m_tests_data).
           super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
  pAVar1->m_gs_code =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(triangles_adjacency)            in;\nlayout(triangle_strip, max_vertices=3) out;\n\nout vec4 out_adjacent_geometry;\nout vec4 out_geometry;\n\nvoid main()\n{\n    out_adjacent_geometry = gl_in[1].gl_Position;\n    out_geometry          = gl_in[0].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[3].gl_Position;\n    out_geometry          = gl_in[2].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[5].gl_Position;\n    out_geometry          = gl_in[4].gl_Position;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  pAVar1->m_mode = 0xc;
  pAVar1->m_tf_mode = 4;
  createGrid(this,pAVar1);
  setTrianglePointsIndiced(this,pAVar1);
  pGVar2 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar2,(this->super_TestCaseGroupBase).m_context,extParams,
             "adjacency_indiced_triangles","Test 2.5 indiced",
             (this->m_tests_data).
             super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar2);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_30 = pAVar1;
  std::vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>>::
  emplace_back<glcts::AdjacencyTestData*>
            ((vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>> *)this_00,
             &local_30);
  pAVar1 = (this->m_tests_data).
           super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
  pAVar1->m_gs_code =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(triangles_adjacency)            in;\nlayout(triangle_strip, max_vertices=3) out;\n\nout vec4 out_adjacent_geometry;\nout vec4 out_geometry;\n\nvoid main()\n{\n    out_adjacent_geometry = gl_in[1].gl_Position;\n    out_geometry          = gl_in[0].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[3].gl_Position;\n    out_geometry          = gl_in[2].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[5].gl_Position;\n    out_geometry          = gl_in[4].gl_Position;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  pAVar1->m_mode = 0xd;
  pAVar1->m_tf_mode = 4;
  createGrid(this,pAVar1);
  setTriangleStripPointsNonindiced(this,pAVar1);
  pGVar2 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar2,(this->super_TestCaseGroupBase).m_context,extParams,
             "adjacency_non_indiced_triangle_strip","Test 2.7 non indiced",
             (this->m_tests_data).
             super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar2);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_30 = pAVar1;
  std::vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>>::
  emplace_back<glcts::AdjacencyTestData*>
            ((vector<glcts::AdjacencyTestData*,std::allocator<glcts::AdjacencyTestData*>> *)this_00,
             &local_30);
  pAVar1 = (this->m_tests_data).
           super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
  pAVar1->m_gs_code =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(triangles_adjacency)            in;\nlayout(triangle_strip, max_vertices=3) out;\n\nout vec4 out_adjacent_geometry;\nout vec4 out_geometry;\n\nvoid main()\n{\n    out_adjacent_geometry = gl_in[1].gl_Position;\n    out_geometry          = gl_in[0].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[3].gl_Position;\n    out_geometry          = gl_in[2].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[5].gl_Position;\n    out_geometry          = gl_in[4].gl_Position;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  pAVar1->m_mode = 0xd;
  pAVar1->m_tf_mode = 4;
  createGrid(this,pAVar1);
  setTriangleStripPointsIndiced(this,pAVar1);
  pGVar2 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar2,(this->super_TestCaseGroupBase).m_context,extParams,
             "adjacency_indiced_triangle_strip","Test 2.7 indiced",
             (this->m_tests_data).
             super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar2);
  return extraout_EAX;
}

Assistant:

void GeometryShaderAdjacencyTests::init(void)
{
	/* Tests for GL_LINES_ADJACENCY_EXT */

	/* Test 2.1 Non indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataLines(*m_tests_data.back(), true, false);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_non_indiced_lines",
										 "Test 2.1 non indiced", *m_tests_data.back()));
	/* Test 2.1 indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataLines(*m_tests_data.back(), true, true);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_indiced_lines", "Test 2.1 indiced",
										 *m_tests_data.back()));

	/* Tests for GL_LINE_STRIP_ADJACENCY_EXT */

	/* Test 2.3 Non indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataLineStrip(*m_tests_data.back(), true, false);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_non_indiced_line_strip",
										 "Test 2.3 non indiced", *m_tests_data.back()));
	/* Test 2.3 indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataLineStrip(*m_tests_data.back(), true, true);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_indiced_line_strip", "Test 2.3 indiced",
										 *m_tests_data.back()));

	/* Tests for GL_TRIANGLES_ADJACENCY_EXT */

	/* Test 2.5 Non indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataTriangles(*m_tests_data.back(), true, false);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_non_indiced_triangles",
										 "Test 2.5 non indiced", *m_tests_data.back()));
	/* Test 2.5 indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataTriangles(*m_tests_data.back(), true, true);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_indiced_triangles", "Test 2.5 indiced",
										 *m_tests_data.back()));

	/* Tests for GL_TRIANGLE_STRIP_ADJACENCY_EXT */

	/* Test 2.7 Non indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataTriangleStrip(*m_tests_data.back(), true, false);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_non_indiced_triangle_strip",
										 "Test 2.7 non indiced", *m_tests_data.back()));
	/* Test 2.7 indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataTriangleStrip(*m_tests_data.back(), true, true);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_indiced_triangle_strip",
										 "Test 2.7 indiced", *m_tests_data.back()));
}